

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t minThreshold,
               uint8_t maxThreshold)

{
  bool bVar1;
  uchar uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  uchar *puVar6;
  byte *pbVar7;
  uchar *puVar8;
  uchar *puVar9;
  byte *pbVar10;
  ImageTemplate<unsigned_char> *in_RCX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff0c;
  int iVar12;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff28;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  ImageTemplate<unsigned_char> *message;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff40;
  imageException *this;
  uint32_t in_stack_ffffffffffffff50;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff58;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff60;
  uint32_t *in_stack_ffffffffffffff68;
  uint32_t *in_stack_ffffffffffffff70;
  imageException local_48;
  int local_20;
  uint local_1c;
  ImageTemplate<unsigned_char> *local_18;
  int local_10;
  uint local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  uVar11 = in_stack_00000008;
  iVar12 = in_stack_00000010;
  local_20 = in_R9D;
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             (uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff50,
             (uint32_t)in_stack_ffffffffffffff58);
  this = &local_48;
  message = local_8;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,iVar12),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar11));
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,iVar12),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar11));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x132f13);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff14,iVar12),
             (ImageTemplate<unsigned_char> *)CONCAT44(in_stack_ffffffffffffff0c,uVar11));
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x132f62);
  if (in_stack_00000020 < in_stack_00000018) {
    uVar5 = __cxa_allocate_exception(0x28);
    imageException::imageException(this,(char *)message);
    __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
  }
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_18);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
  pbVar7 = puVar6 + (ulong)local_c + (ulong)(local_10 * uVar3);
  puVar6 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_18);
  puVar6 = puVar6 + (ulong)local_1c + (ulong)(local_20 * uVar4);
  puVar8 = puVar6 + in_stack_00000010 * uVar4;
  for (; puVar6 != puVar8; puVar6 = puVar6 + uVar4) {
    pbVar10 = pbVar7;
    for (puVar9 = puVar6; puVar9 != puVar6 + in_stack_00000008; puVar9 = puVar9 + 1) {
      bVar1 = true;
      if (in_stack_00000018 <= *pbVar10) {
        bVar1 = in_stack_00000020 < *pbVar10;
      }
      uVar2 = 0xff;
      if (bVar1) {
        uVar2 = '\0';
      }
      *puVar9 = uVar2;
      pbVar10 = pbVar10 + 1;
    }
    pbVar7 = pbVar7 + uVar3;
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t minThreshold, uint8_t maxThreshold )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );
        OptimiseRoi( width, height, in, out );

        if( minThreshold > maxThreshold )
            throw imageException( "Minimum threshold value is bigger than maximum threshold value" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = (*inX) < minThreshold || (*inX) > maxThreshold ? 0 : 255;
        }
    }